

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectGenericLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,false,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  if (count == 0) {
    lVar7 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar7 = 0;
    uVar9 = 0;
    do {
      uVar8 = uVar9;
      if (psVar1 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar1[uVar9];
      }
      uVar10 = uVar9;
      if (psVar2 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar2[uVar9];
      }
      uVar6 = uVar9;
      if (psVar3 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar3[uVar9];
      }
      if (((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
         && ((puVar5 == (unsigned_long *)0x0 || ((puVar5[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0))))
      {
        if (((ldata[uVar10].months == rdata[uVar6].months) &&
            (ldata[uVar10].days == rdata[uVar6].days)) &&
           (ldata[uVar10].micros == rdata[uVar6].micros)) goto LAB_00f0c8d7;
        lVar11 = (long)ldata[uVar10].days + ldata[uVar10].micros / 86400000000;
        lVar12 = (long)rdata[uVar6].days + rdata[uVar6].micros / 86400000000;
        if ((((long)ldata[uVar10].months + lVar11 / 0x1e ==
              (long)rdata[uVar6].months + lVar12 / 0x1e) && (lVar11 % 0x1e == lVar12 % 0x1e)) &&
           (ldata[uVar10].micros % 86400000000 == rdata[uVar6].micros % 86400000000))
        goto LAB_00f0c8d7;
      }
      else {
LAB_00f0c8d7:
        false_sel->sel_vector[lVar7] = (sel_t)uVar8;
        lVar7 = lVar7 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (count != uVar9);
  }
  return count - lVar7;
}

Assistant:

static inline idx_t
	SelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                  const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                  const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                  ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
#ifdef DUCKDB_SMALLER_BINARY
		const bool HAS_TRUE_SEL = true_sel;
		const bool HAS_FALSE_SEL = false_sel;
		const bool NO_NULL = false;
#endif
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto lindex = lsel->get_index(i);
			auto rindex = rsel->get_index(i);
			if ((NO_NULL || (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex))) &&
			    OP::Operation(ldata[lindex], rdata[rindex])) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}